

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O2

void __thiscall Jinx::Impl::Parser::ErrorWriteDetails(Parser *this)

{
  pointer pSVar1;
  Symbol *pSVar2;
  byte bVar3;
  size_type sVar4;
  pointer pSVar5;
  size_type sVar6;
  pointer pSVar7;
  char *__s;
  ulong uVar8;
  SymbolListCItr curr;
  SymbolListCItr symbol;
  ulong uVar9;
  size_t i;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  pointer local_88;
  ulong local_80;
  String markerText;
  String symbolText;
  
  pSVar5 = (this->m_currentSymbol)._M_current;
  pSVar1 = (this->m_symbolList->
           super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pSVar7 = pSVar5 + -1;
  if (pSVar1 != pSVar5) {
    pSVar7 = pSVar5;
  }
  pSVar5 = pSVar7 + -1;
  if (pSVar7->type != NewLine) {
    pSVar5 = pSVar7;
  }
  for (; pSVar5->type != NewLine; pSVar5 = pSVar5 + -1) {
    symbol._M_current = pSVar5;
    if (pSVar5 == (this->m_symbolList->
                  super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                  _M_impl.super__Vector_impl_data._M_start) goto LAB_001cbf47;
  }
  pSVar5 = pSVar5 + 1;
  symbol._M_current = pSVar5;
LAB_001cbf47:
  for (; (local_88 = pSVar1, pSVar5 != pSVar1 && (local_88 = pSVar5, pSVar5->type != NewLine));
      pSVar5 = pSVar5 + 1) {
  }
  symbolText._M_dataplus._M_p = (pointer)&symbolText.field_2;
  symbolText._M_string_length = 0;
  symbolText.field_2._M_local_buf[0] = '\0';
  local_80 = 0;
  uVar8 = 0;
  lVar10 = 0;
  bVar3 = 0;
  for (; symbol._M_current != local_88; symbol._M_current = symbol._M_current + 1) {
    WriteSymbol(symbol,&symbolText);
    sVar4 = symbolText._M_string_length;
    pSVar2 = (this->m_currentSymbol)._M_current;
    LogWrite(Error,symbolText._M_dataplus._M_p);
    bVar12 = symbol._M_current == pSVar2;
    sVar6 = sVar4;
    uVar9 = local_80;
    if ((bool)(bVar3 | bVar12)) {
      sVar6 = 0;
      uVar9 = uVar8;
    }
    uVar8 = uVar9;
    local_80 = local_80 + sVar6;
    lVar10 = lVar10 + sVar4;
    bVar3 = bVar3 | bVar12;
  }
  uVar9 = 0;
  if (lVar10 != 0) {
    uVar9 = lVar10 - 1;
  }
  if (local_80 < uVar9) {
    uVar8 = local_80;
  }
  LogWrite(Error,"\n");
  markerText._M_dataplus._M_p = (pointer)&markerText.field_2;
  markerText._M_string_length = 0;
  markerText.field_2._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::reserve
            (&markerText,0x20);
  for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
    __s = "^";
    if (uVar11 < uVar8) {
      __s = " ";
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
              (&markerText,__s);
  }
  LogWriteLine(Error,markerText._M_dataplus._M_p);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            (&markerText);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            (&symbolText);
  return;
}

Assistant:

inline_t void Parser::ErrorWriteDetails() const
	{
		// Write line of code containing error

		// Find starting symbol of error line.  Harder than you might think
		auto start = m_currentSymbol;
		if (start == m_symbolList.end())
			--start;
		if (start->type == SymbolType::NewLine)
			--start;
		while (start->type != SymbolType::NewLine && start != m_symbolList.begin())
			--start;
		if (start->type == SymbolType::NewLine)
			++start;

		// Once we find the supposed start, find the end from that location
		auto end = start;
		while (end != m_symbolList.end() && end->type != SymbolType::NewLine)
			++end;

		// Print out the symbols and find error start index
		bool foundError = false;
		size_t errorIndex = 0;
		size_t lastErrorIndex = 0;
		size_t endIndex = 0;
		String symbolText;
		for (auto curr = start; curr != end; ++curr)
		{
			WriteSymbol(curr, symbolText);
			if (curr == m_currentSymbol)
				foundError = true;
			if (!foundError)
			{
				lastErrorIndex = errorIndex;
				errorIndex += symbolText.size();
			}
			endIndex += symbolText.size();
			LogWrite(LogLevel::Error, symbolText.c_str());
		}
		if (endIndex)
			--endIndex;
		if (errorIndex >= endIndex)
			errorIndex = lastErrorIndex;
		LogWrite(LogLevel::Error, "\n");

		// Write marker showing location of error
		String markerText;
		markerText.reserve(32);
		for (size_t i = 0; i < endIndex; ++i)
			markerText += (i < errorIndex) ? " " : "^";
		LogWriteLine(LogLevel::Error, markerText.c_str());
	}